

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void EndMode2D(void)

{
  Matrix mat;
  undefined8 in_stack_ffffffffffffffb8;
  
  rlDrawRenderBatchActive();
  rlLoadIdentity();
  mat.m8 = CORE.Window.screenScale.m1;
  mat.m12 = CORE.Window.screenScale.m5;
  mat.m0 = CORE.Window.screenScale.m8;
  mat.m4 = CORE.Window.screenScale.m12;
  mat.m1 = CORE.Window.screenScale.m9;
  mat.m5 = CORE.Window.screenScale.m13;
  mat.m9 = CORE.Window.screenScale.m2;
  mat.m13 = CORE.Window.screenScale.m6;
  mat.m2 = CORE.Window.screenScale.m10;
  mat.m6 = CORE.Window.screenScale.m14;
  mat.m10 = CORE.Window.screenScale.m3;
  mat.m14 = CORE.Window.screenScale.m7;
  mat.m3 = CORE.Window.screenScale.m11;
  mat.m7 = CORE.Window.screenScale.m15;
  mat.m11 = (float)(int)in_stack_ffffffffffffffb8;
  mat.m15 = (float)(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  MatrixToFloatV(mat);
  rlMultMatrixf((float *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

void EndMode2D(void)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

    rlLoadIdentity();               // Reset current matrix (modelview)
    rlMultMatrixf(MatrixToFloat(CORE.Window.screenScale)); // Apply screen scaling if required
}